

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void sendOneToWSRCohort(WS_ReaderInfo CP_WSR_Stream,CMFormat f,void *Msg,void **RS_StreamPtr)

{
  uint uVar1;
  SstStream s;
  CMConnection p_Var2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  s = CP_WSR_Stream->ParentStream;
  if (s->ConfigParams->CPCommPattern == 1) {
    lVar5 = 0;
    while( true ) {
      uVar1 = *(uint *)((long)CP_WSR_Stream->Peers + lVar5);
      lVar4 = (long)(int)uVar1;
      if (lVar4 == -1) break;
      p_Var2 = CP_WSR_Stream->Connections[lVar4].CMconn;
      *RS_StreamPtr = CP_WSR_Stream->Connections[lVar4].RemoteStreamID;
      CP_verbose(s,TraceVerbose,"Sending a message to reader %d (%p)\n",(ulong)uVar1);
      if (p_Var2 != (CMConnection)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
        iVar3 = CMwrite(p_Var2,f,Msg);
        pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
        if (iVar3 != 1) {
          CP_verbose(s,PerStepVerbose,"Message failed to send to reader %d (%p)\n",(ulong)uVar1,
                     *RS_StreamPtr);
          CP_PeerFailCloseWSReader(CP_WSR_Stream,PeerFailed);
        }
      }
      lVar5 = lVar5 + 4;
    }
  }
  else if (s->Rank == 0) {
    p_Var2 = CP_WSR_Stream->Connections->CMconn;
    *RS_StreamPtr = CP_WSR_Stream->Connections->RemoteStreamID;
    CP_verbose(s,TraceVerbose,"Sending a message to reader %d (%p)\n",0);
    if (p_Var2 != (CMConnection)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
      iVar3 = CMwrite(p_Var2,f,Msg);
      pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
      if (iVar3 != 1) {
        CP_verbose(s,PerStepVerbose,"Message failed to send to reader %d (%p)\n",0,*RS_StreamPtr);
        CP_PeerFailCloseWSReader(CP_WSR_Stream,PeerFailed);
        return;
      }
    }
  }
  return;
}

Assistant:

void sendOneToWSRCohort(WS_ReaderInfo CP_WSR_Stream, CMFormat f, void *Msg, void **RS_StreamPtr)
{
    SstStream Stream = CP_WSR_Stream->ParentStream;
    int j = 0;

    STREAM_ASSERT_LOCKED(Stream);
    if (Stream->ConfigParams->CPCommPattern == SstCPCommPeer)
    {
        while (CP_WSR_Stream->Peers[j] != -1)
        {
            int peer = CP_WSR_Stream->Peers[j];
            CMConnection conn = CP_WSR_Stream->Connections[peer].CMconn;
            /* add the reader-rank-specific Stream identifier to each outgoing
             * message */
            *RS_StreamPtr = CP_WSR_Stream->Connections[peer].RemoteStreamID;
            CP_verbose(Stream, TraceVerbose, "Sending a message to reader %d (%p)\n", peer,
                       (void *)*RS_StreamPtr);

            if (conn)
            {
                int res;
                STREAM_MUTEX_UNLOCK(Stream);
                res = CMwrite(conn, f, Msg);
                STREAM_MUTEX_LOCK(Stream);
                if (res != 1)
                {
                    CP_verbose(Stream, PerStepVerbose, "Message failed to send to reader %d (%p)\n",
                               peer, (void *)*RS_StreamPtr);
                    CP_PeerFailCloseWSReader(CP_WSR_Stream, PeerFailed);
                }
            }
            j++;
        }
    }
    else
    {
        /* CommMin */
        if (Stream->Rank == 0)
        {
            int peer = 0;
            CMConnection conn = CP_WSR_Stream->Connections[peer].CMconn;
            /* add the reader-rank-specific Stream identifier to each outgoing
             * message */
            *RS_StreamPtr = CP_WSR_Stream->Connections[peer].RemoteStreamID;
            CP_verbose(Stream, TraceVerbose, "Sending a message to reader %d (%p)\n", peer,
                       (void *)*RS_StreamPtr);

            if (conn)
            {
                int res;
                STREAM_MUTEX_UNLOCK(Stream);
                res = CMwrite(conn, f, Msg);
                STREAM_MUTEX_LOCK(Stream);
                if (res != 1)
                {
                    CP_verbose(Stream, PerStepVerbose, "Message failed to send to reader %d (%p)\n",
                               peer, (void *)*RS_StreamPtr);
                    CP_PeerFailCloseWSReader(CP_WSR_Stream, PeerFailed);
                }
            }
        }
    }
}